

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

void Lf_ManSetMapRefsOne(Lf_Man_t *p,int iObj)

{
  long *plVar1;
  uint *puVar2;
  Jf_Par_t *pJVar3;
  int iVar4;
  int iVar5;
  Lf_Plc_t LVar6;
  Lf_Bst_t *pLVar7;
  Gia_Obj_t *pGVar8;
  Lf_Cut_t *pCut;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  
  pLVar7 = Lf_ObjReadBest(p,iObj);
  iVar4 = Vec_IntEntry(&p->vRequired,iObj);
  iVar5 = Lf_ObjMapRefNum(p,iObj);
  if (iVar5 < 1) {
    __assert_fail("Lf_ObjMapRefNum(p, iObj) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x5aa,"void Lf_ManSetMapRefsOne(Lf_Man_t *, int)");
  }
  if ((((uint)pLVar7->Cut[0] & 1) != 0) || (((uint)pLVar7->Cut[1] & 1) != 0)) {
    __assert_fail("!pBest->Cut[0].fUsed && !pBest->Cut[1].fUsed",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x5ab,"void Lf_ManSetMapRefsOne(Lf_Man_t *, int)");
  }
  if (p->pPars->fUseMux7 != 0) {
    puVar2 = p->pGia->pMuxes;
    if ((((puVar2 != (uint *)0x0) && (puVar2[iObj] != 0)) && (pLVar7->Delay[2] <= iVar4)) &&
       (pLVar7->Flow[2] <= pLVar7->Flow[1] * 1.1)) {
      pGVar8 = Gia_ManObj(p->pGia,iObj);
      uVar10 = (uint)*(undefined8 *)pGVar8;
      if ((uVar10 >> 0x1e & 1) == 0) {
        uVar12 = (ulong)(uVar10 & 0x1fffffff);
        if ((((uint)*(ulong *)(pGVar8 + -uVar12) >> 0x1e & 1) == 0) &&
           ((pGVar8[-(ulong)((uint)((ulong)*(undefined8 *)pGVar8 >> 0x20) & 0x1fffffff)].field_0x3 &
            0x40) == 0)) {
          *(ulong *)(pGVar8 + -uVar12) = *(ulong *)(pGVar8 + -uVar12) | 0x40000000;
          *(ulong *)(pGVar8 + -(ulong)(*(uint *)&pGVar8->field_0x4 & 0x1fffffff)) =
               *(ulong *)(pGVar8 + -(ulong)(*(uint *)&pGVar8->field_0x4 & 0x1fffffff)) | 0x40000000;
          goto LAB_005bfc8c;
        }
      }
    }
  }
  LVar6 = pLVar7->Cut[0];
  if (((uint)pLVar7->Cut[1] ^ (uint)LVar6) < 2) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)(pLVar7->Delay[1] <= iVar4);
    LVar6 = pLVar7->Cut[uVar12];
  }
  pLVar7->Cut[uVar12] = (Lf_Plc_t)((uint)LVar6 | 1);
LAB_005bfc8c:
  pCut = Lf_ObjCutBest(p,iObj);
  uVar10 = *(uint *)&pCut->field_0x14;
  if (((byte)(uVar10 >> 0x17) & (uVar10 & 0xff000000) != 0x3000000) == 0) {
    for (uVar12 = 0; uVar9 = (ulong)(uVar10 >> 0x18), uVar12 < uVar9; uVar12 = uVar12 + 1) {
      Lf_ObjSetRequired(p,*(int *)((long)&pCut[1].Sign + uVar12 * 4),iVar4 + -1);
      pGVar8 = Gia_ManObj(p->pGia,*(int *)((long)&pCut[1].Sign + uVar12 * 4));
      iVar5 = Gia_ObjIsAndNotBuf(pGVar8);
      if (iVar5 != 0) {
        Lf_ObjMapRefInc(p,*(int *)((long)&pCut[1].Sign + uVar12 * 4));
      }
      uVar10 = *(uint *)&pCut->field_0x14;
    }
    if ((uVar10 >> 0x17 & 1) == 0) {
      lVar13 = 0xa0;
      lVar11 = 0xa8;
      if ((p->vSwitches).nSize != 0) {
        fVar14 = Lf_CutSwitches(p,pCut);
        p->Switches = (double)fVar14 + p->Switches;
        uVar9 = (ulong)(byte)pCut->field_0x17;
      }
    }
    else {
      lVar13 = 0xa8;
      uVar9 = 1;
      lVar11 = 0xb8;
    }
    pJVar3 = p->pPars;
    plVar1 = (long *)((long)&pJVar3->nLutSize + lVar11);
    *plVar1 = *plVar1 + uVar9;
    plVar1 = (long *)((long)&pJVar3->nLutSize + lVar13);
    *plVar1 = *plVar1 + 1;
    return;
  }
  __assert_fail("!pCut->fMux7 || pCut->nLeaves == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                ,0x5b2,"void Lf_ManSetMapRefsOne(Lf_Man_t *, int)");
}

Assistant:

void Lf_ManSetMapRefsOne( Lf_Man_t * p, int iObj )
{
    Lf_Cut_t * pCut;
    Lf_Bst_t * pBest = Lf_ObjReadBest( p, iObj );
    int k, Index, Required = Lf_ObjRequired( p, iObj );
    assert( Lf_ObjMapRefNum(p, iObj) > 0 );
    assert( !pBest->Cut[0].fUsed && !pBest->Cut[1].fUsed );
    if ( !p->pPars->fUseMux7 || !Lf_ManSetMuxCut(p, pBest, iObj, Required) )
    {
        Index = (int)(Lf_BestDiffCuts(pBest) && pBest->Delay[1] <= Required);
        pBest->Cut[Index].fUsed = 1;
    }
    pCut = Lf_ObjCutBest( p, iObj );
    assert( !pCut->fMux7 || pCut->nLeaves == 3 );
//    assert( pCut->Delay <= Required );
    for ( k = 0; k < (int)pCut->nLeaves; k++ )
    {
//        if ( pCut->fMux7 && pCut->pLeaves[k] != Gia_ObjFaninId2(p->pGia, iObj) )
//            Lf_ObjSetRequired( p, pCut->pLeaves[k], Required );
//        else
            Lf_ObjSetRequired( p, pCut->pLeaves[k], Required - 1 );
        if ( Gia_ObjIsAndNotBuf(Gia_ManObj(p->pGia, pCut->pLeaves[k])) )
            Lf_ObjMapRefInc( p, pCut->pLeaves[k] );
    }
    if ( pCut->fMux7 )
    {
        p->pPars->Mux7++;
        p->pPars->Edge++;
        return;
    }
    if ( Vec_FltSize(&p->vSwitches) )
        p->Switches += Lf_CutSwitches(p, pCut);
    p->pPars->Edge += pCut->nLeaves;
    p->pPars->Area++;
}